

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

void nghttp2_map_each_free(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = map->tablelen;
  if (uVar2 != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      pvVar1 = *(void **)((long)&map->table->hash + lVar3);
      if (pvVar1 != (void *)0x0) {
        (*func)(pvVar1,ptr);
        uVar2 = map->tablelen;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

void nghttp2_map_each_free(nghttp2_map *map, int (*func)(void *data, void *ptr),
                           void *ptr) {
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    func(bkt->data, ptr);
  }
}